

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O3

Vector3f __thiscall
pbrt::PortalImageInfiniteLight::RenderFromImage
          (PortalImageInfiniteLight *this,Point2f uv,Float *duv_dw)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 in_register_00001208 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  Vector3f VVar13;
  float local_28;
  
  auVar11._8_56_ = in_register_00001208;
  auVar11._0_8_ = uv.super_Tuple2<pbrt::Point2,_float>;
  auVar12 = vmovshdup_avx(auVar11._0_16_);
  auVar12 = vfmadd213ss_fma(auVar12,SUB6416(ZEXT464(0x40490fdb),0),SUB6416(ZEXT464(0xbfc90fdb),0));
  auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40490fdb),0),auVar11._0_16_,
                           SUB6416(ZEXT464(0xbfc90fdb),0));
  fVar8 = tanf(auVar7._0_4_);
  local_28 = auVar12._0_4_;
  fVar9 = tanf(local_28);
  auVar12 = ZEXT416((uint)(fVar8 * fVar8 + fVar9 * fVar9 + 1.0));
  auVar12 = vsqrtss_avx(auVar12,auVar12);
  fVar10 = auVar12._0_4_;
  fVar9 = fVar9 / fVar10;
  fVar8 = fVar8 / fVar10;
  fVar10 = 1.0 / fVar10;
  if (duv_dw != (Float *)0x0) {
    *duv_dw = ((1.0 - fVar9 * fVar9) * (1.0 - fVar8 * fVar8) * 9.869605) / fVar10;
  }
  uVar1 = (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.x;
  uVar4 = (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.y;
  uVar2 = (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.x;
  uVar5 = (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.y;
  uVar3 = (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.x;
  uVar6 = (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.y;
  VVar13.super_Tuple3<pbrt::Vector3,_float>.x =
       fVar8 * (float)uVar1 + fVar9 * (float)uVar3 + fVar10 * (float)uVar2;
  VVar13.super_Tuple3<pbrt::Vector3,_float>.y =
       fVar8 * (float)uVar4 + fVar9 * (float)uVar6 + fVar10 * (float)uVar5;
  VVar13.super_Tuple3<pbrt::Vector3,_float>.z =
       fVar8 * (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.z +
       fVar9 * (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.z +
       fVar10 * (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.z;
  return (Vector3f)VVar13.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU
    Vector3f RenderFromImage(Point2f uv, Float *duv_dw = nullptr) const {
        Float alpha = -Pi / 2 + uv[0] * Pi, beta = -Pi / 2 + uv[1] * Pi;
        Float x = std::tan(alpha), y = std::tan(beta);
        DCHECK(!IsInf(x) && !IsInf(y));
        Vector3f w = Normalize(Vector3f(x, y, 1));
        // Compute Jacobian determinant of mapping $\roman{d}(u,v)/\roman{d}\omega$ if
        // needed
        if (duv_dw)
            *duv_dw = Sqr(Pi) * (1 - Sqr(w.x)) * (1 - Sqr(w.y)) / w.z;

        return portalFrame.FromLocal(w);
    }